

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_dependent_join.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::FlattenDependentJoins::Decorrelate
          (FlattenDependentJoins *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *plan,bool parent_propagate_null_values,idx_t lateral_depth)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *pvVar1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_00;
  vector<duckdb::LogicalType,_true> *pvVar2;
  vector<duckdb::LogicalType,_true> *this_01;
  LogicalOperatorType LVar3;
  bool bVar4;
  pointer puVar5;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var6;
  long lVar7;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> uVar8;
  undefined8 uVar9;
  _Alloc_hider delim_join;
  LogicalOperatorVisitor LVar10;
  Binder *pBVar11;
  byte bVar12;
  pointer pLVar13;
  LogicalDependentJoin *pLVar14;
  iterator iVar15;
  reference pvVar16;
  type pLVar17;
  reference pvVar18;
  pointer pBVar19;
  pointer pLVar20;
  pointer pLVar21;
  reference pvVar22;
  reference pvVar23;
  reference args_1;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var24;
  BinderException *this_02;
  undefined7 in_register_00000011;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *this_03;
  vector<duckdb::JoinCondition,_true> *this_04;
  ulong uVar25;
  pointer puVar26;
  JoinCondition compare_cond;
  undefined1 local_210 [16];
  _Alloc_hider local_200;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1f8;
  undefined1 local_1f0 [16];
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_1e0;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_1d8;
  vector<duckdb::ColumnBinding,_true> plan_columns;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_1b0;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_1a8;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_1a0;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_198;
  RewriteCorrelatedExpressions rewriter;
  _Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> local_160;
  _Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> local_148;
  FlattenDependentJoins flatten;
  
  this_03 = (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             *)CONCAT71(in_register_00000011,parent_propagate_null_values);
  pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->(this_03);
  LVar3 = pLVar13->type;
  pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->(this_03);
  if (LVar3 != LOGICAL_DEPENDENT_JOIN) {
    puVar5 = (pLVar13->children).
             super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar26 = (pLVar13->children).
                   super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar26 != puVar5;
        puVar26 = puVar26 + 1) {
      local_1f0._0_8_ =
           (puVar26->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (puVar26->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      Decorrelate(&flatten,plan,SUB81(local_1f0,0),1);
      _Var24._M_head_impl =
           (puVar26->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (puVar26->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (LogicalOperator *)flatten.binder;
      if (_Var24._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(_Var24._M_head_impl)->_vptr_LogicalOperator + 8))();
      }
      if ((LogicalOperator *)local_1f0._0_8_ != (LogicalOperator *)0x0) {
        (**(code **)(*(long *)local_1f0._0_8_ + 8))();
      }
    }
    this->binder = (Binder *)
                   (this_03->
                   super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                   )._M_t.
                   super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                   .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (this_03->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
  }
  pLVar14 = LogicalOperator::Cast<duckdb::LogicalDependentJoin>(pLVar13);
  if (plan[0x1f].
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl ==
      (LogicalOperator *)0x0) {
    pvVar1 = &(pLVar14->super_LogicalComparisonJoin).super_LogicalJoin.super_LogicalOperator.
              children;
    pvVar16 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::get<true>(pvVar1,0);
    local_1a8._M_head_impl =
         (pvVar16->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (pvVar16->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    Decorrelate(&flatten,plan,SUB81(&local_1a8,0),1);
    pvVar16 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::get<true>(pvVar1,0);
    _Var24._M_head_impl =
         (pvVar16->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (pvVar16->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (LogicalOperator *)flatten.binder;
    if (_Var24._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(_Var24._M_head_impl)->_vptr_LogicalOperator + 8))();
    }
    if (local_1a8._M_head_impl != (LogicalOperator *)0x0) {
      (*(local_1a8._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    local_1a8._M_head_impl = (LogicalOperator *)0x0;
  }
  else {
    flatten.binder =
         (Binder *)
         unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
         operator*(this_03);
    iVar15 = ::std::
             _Hashtable<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(plan + 5),(key_type *)&flatten);
    if (*(char *)((long)iVar15.
                        super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_true>
                        ._M_cur + 0x10) == '\x01') {
      pvVar1 = &(pLVar14->super_LogicalComparisonJoin).super_LogicalJoin.super_LogicalOperator.
                children;
      pvVar16 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::get<true>(pvVar1,0);
      local_198._M_head_impl =
           (pvVar16->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (pvVar16->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      PushDownDependentJoin(&flatten,plan,SUB81(&local_198,0),lateral_depth & 0xff);
      pvVar16 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::get<true>(pvVar1,0);
      pBVar11 = flatten.binder;
      flatten.binder = (Binder *)0x0;
      _Var24._M_head_impl =
           (pvVar16->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (pvVar16->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (LogicalOperator *)pBVar11;
      if (_Var24._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(_Var24._M_head_impl)->_vptr_LogicalOperator + 8))();
      }
      if (flatten.binder != (Binder *)0x0) {
        (*(code *)((((flatten.binder)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.
                    internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      flatten.binder = (Binder *)0x0;
      if (local_198._M_head_impl != (LogicalOperator *)0x0) {
        (*(local_198._M_head_impl)->_vptr_LogicalOperator[1])();
      }
      local_198._M_head_impl = (LogicalOperator *)0x0;
    }
    else {
      _Var24._M_head_impl =
           (plan->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      pvVar1 = &(pLVar14->super_LogicalComparisonJoin).super_LogicalJoin.super_LogicalOperator.
                children;
      pvVar16 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::get<true>(pvVar1,0);
      local_1a0._M_head_impl =
           (pvVar16->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (pvVar16->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      DecorrelateIndependent
                (&flatten,(Binder *)_Var24._M_head_impl,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_1a0);
      pvVar16 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::get<true>(pvVar1,0);
      pBVar11 = flatten.binder;
      flatten.binder = (Binder *)0x0;
      _Var24._M_head_impl =
           (pvVar16->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (pvVar16->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (LogicalOperator *)pBVar11;
      if (_Var24._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(_Var24._M_head_impl)->_vptr_LogicalOperator + 8))();
      }
      if (flatten.binder != (Binder *)0x0) {
        (*(code *)((((flatten.binder)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.
                    internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      flatten.binder = (Binder *)0x0;
      if (local_1a0._M_head_impl != (LogicalOperator *)0x0) {
        (*(local_1a0._M_head_impl)->_vptr_LogicalOperator[1])();
      }
      local_1a0._M_head_impl = (LogicalOperator *)0x0;
    }
    RewriteCorrelatedExpressions::RewriteCorrelatedExpressions
              ((RewriteCorrelatedExpressions *)&flatten,*(ColumnBinding *)(plan + 1),
               (column_binding_map_t<idx_t> *)(plan + 0xc),0,false);
    pLVar17 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator*(this_03);
    RewriteCorrelatedExpressions::VisitOperator((RewriteCorrelatedExpressions *)&flatten,pLVar17);
    RewriteCorrelatedExpressions::RewriteCorrelatedExpressions
              (&rewriter,*(ColumnBinding *)(plan + 1),(column_binding_map_t<idx_t> *)(plan + 0xc),0,
               true);
    pLVar17 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator*(this_03);
    RewriteCorrelatedExpressions::VisitOperator(&rewriter,pLVar17);
  }
  bVar12 = 1;
  if (pLVar14->perform_delim == false) {
    pvVar18 = vector<duckdb::CorrelatedColumnInfo,_true>::get<true>(&pLVar14->correlated_columns,0);
    make_uniq<duckdb::LogicalWindow,unsigned_long&>((duckdb *)&rewriter,(unsigned_long *)pvVar18);
    local_210[0] = 0x7d;
    flatten.binder = (Binder *)0x0;
    plan_columns.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    make_uniq<duckdb::BoundWindowExpression,duckdb::ExpressionType,duckdb::LogicalTypeId_const&,decltype(nullptr),decltype(nullptr)>
              ((ExpressionType *)&compare_cond,local_210,(void **)&LogicalType::BIGINT,
               &flatten.binder);
    pBVar19 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                            *)&compare_cond);
    pBVar19->start = UNBOUNDED_PRECEDING;
    pBVar19 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                            *)&compare_cond);
    pBVar19->end = CURRENT_ROW_ROWS;
    pBVar19 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                            *)&compare_cond);
    ::std::__cxx11::string::string((string *)&flatten,"delim_index",(allocator *)&plan_columns);
    ::std::__cxx11::string::operator=
              ((string *)&(pBVar19->super_Expression).super_BaseExpression.alias,(string *)&flatten)
    ;
    ::std::__cxx11::string::~string((string *)&flatten);
    pLVar20 = unique_ptr<duckdb::LogicalWindow,_std::default_delete<duckdb::LogicalWindow>,_true>::
              operator->((unique_ptr<duckdb::LogicalWindow,_std::default_delete<duckdb::LogicalWindow>,_true>
                          *)&rewriter);
    flatten.binder = (Binder *)compare_cond.left;
    compare_cond.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
    ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&(pLVar20->super_LogicalOperator).expressions,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &flatten);
    if (flatten.binder != (Binder *)0x0) {
      (*(code *)((((flatten.binder)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.
                  internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    pLVar20 = unique_ptr<duckdb::LogicalWindow,_std::default_delete<duckdb::LogicalWindow>,_true>::
              operator->((unique_ptr<duckdb::LogicalWindow,_std::default_delete<duckdb::LogicalWindow>,_true>
                          *)&rewriter);
    pvVar1 = &(pLVar14->super_LogicalComparisonJoin).super_LogicalJoin.super_LogicalOperator.
              children;
    pvVar16 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::get<true>(pvVar1,0);
    local_1d8._M_head_impl =
         (pvVar16->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (pvVar16->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    LogicalOperator::AddChild
              (&pLVar20->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_1d8);
    if (local_1d8._M_head_impl != (LogicalOperator *)0x0) {
      (*(local_1d8._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    LVar10._vptr_LogicalOperatorVisitor =
         rewriter.super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor;
    local_1d8._M_head_impl = (LogicalOperator *)0x0;
    rewriter.super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor = (_func_int **)0x0;
    pvVar16 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::get<true>(pvVar1,0);
    _Var24._M_head_impl =
         (pvVar16->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (pvVar16->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (LogicalOperator *)LVar10._vptr_LogicalOperatorVisitor;
    if (_Var24._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(_Var24._M_head_impl)->_vptr_LogicalOperator + 8))();
    }
    if (compare_cond.left.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
        0x0) {
      (**(code **)(*(long *)compare_cond.left.
                            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                            .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))()
      ;
    }
    if (rewriter.super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor != (_func_int **)0x0) {
      (**(code **)(*rewriter.super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor + 8))();
    }
    bVar12 = pLVar14->perform_delim;
  }
  bVar4 = pLVar14->propagate_null_values;
  local_210._8_8_ = &pLVar14->correlated_columns;
  FlattenDependentJoins
            (&flatten,(Binder *)
                      (plan->
                      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      )._M_t.
                      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
             (vector<duckdb::CorrelatedColumnInfo,_true> *)local_210._8_8_,(bool)(bVar12 & 1),
             pLVar14->any_join,(optional_ptr<duckdb::FlattenDependentJoins,_true>)plan);
  pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->(this_03);
  pvVar16 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::get<true>(&pLVar13->children,1);
  pLVar17 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(pvVar16);
  DetectCorrelatedExpressions(&flatten,pLVar17,pLVar14->is_lateral_join,0,false);
  pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->(this_03);
  pvVar16 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::get<true>(&pLVar13->children,1);
  local_1b0._M_head_impl =
       (pvVar16->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (pvVar16->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  PushDownDependentJoin
            ((FlattenDependentJoins *)&rewriter,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&flatten,SUB81(&local_1b0,0),(ulong)bVar4);
  pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->(this_03);
  pvVar16 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::get<true>(&pLVar13->children,1);
  LVar10 = rewriter.super_LogicalOperatorVisitor;
  rewriter.super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor = (_func_int **)0x0;
  _Var24._M_head_impl =
       (pvVar16->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (pvVar16->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (LogicalOperator *)LVar10._vptr_LogicalOperatorVisitor;
  if (_Var24._M_head_impl != (LogicalOperator *)0x0) {
    (**(code **)((long)(_Var24._M_head_impl)->_vptr_LogicalOperator + 8))();
  }
  if (rewriter.super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor != (_func_int **)0x0) {
    (**(code **)(*rewriter.super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor + 8))();
  }
  rewriter.super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor = (_func_int **)0x0;
  if (local_1b0._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_1b0._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  local_1b0._M_head_impl = (LogicalOperator *)0x0;
  plan[3].super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
  _M_t.super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (LogicalOperator *)flatten.delim_offset;
  plan[4].super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
  _M_t.super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (LogicalOperator *)flatten.data_offset;
  RewriteCorrelatedExpressions::RewriteCorrelatedExpressions
            (&rewriter,*(ColumnBinding *)(plan + 1),(column_binding_map_t<idx_t> *)(plan + 0xc),0,
             false);
  pLVar17 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(this_03);
  RewriteCorrelatedExpressions::VisitOperator(&rewriter,pLVar17);
  this_00 = &(pLVar14->super_LogicalComparisonJoin).duplicate_eliminated_columns;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::clear(&this_00->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         );
  pvVar2 = &(pLVar14->super_LogicalComparisonJoin).mark_types;
  local_200._M_p = (pointer)pLVar14;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::clear
            (&pvVar2->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  for (uVar25 = 0;
      uVar25 < (ulong)(((long)*(pointer *)(local_200._M_p + 0x128) -
                       (long)(((vector<duckdb::CorrelatedColumnInfo,_true> *)
                              (local_200._M_p + 0x120))->
                             super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                             ).
                             super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x50); uVar25 = uVar25 + 1
      ) {
    pvVar18 = vector<duckdb::CorrelatedColumnInfo,_true>::get<true>
                        ((vector<duckdb::CorrelatedColumnInfo,_true> *)local_210._8_8_,uVar25);
    make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType&,duckdb::ColumnBinding&>
              ((duckdb *)&plan_columns,&pvVar18->type,&pvVar18->binding);
    compare_cond.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
    ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         plan_columns.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
         super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
         super__Vector_impl_data._M_start;
    plan_columns.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)this_00,&compare_cond.left);
    if (compare_cond.left.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
        0x0) {
      (**(code **)(*(long *)compare_cond.left.
                            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                            .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))()
      ;
    }
    compare_cond.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
    ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0;
    if (plan_columns.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)((plan_columns.
                    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start)->table_index + 8))();
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&pvVar2->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &pvVar18->type);
  }
  pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->(this_03);
  delim_join._M_p = local_200._M_p;
  pLVar13->type = LOGICAL_DELIM_JOIN;
  pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->(this_03);
  pvVar16 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::get<true>(&pLVar13->children,1);
  pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->(pvVar16);
  (*pLVar13->_vptr_LogicalOperator[2])(&plan_columns,pLVar13);
  if (((bool)delim_join._M_p[0x13c] == true) && (delim_join._M_p[0x138] == INVALID)) {
    pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->(this_03);
    pvVar16 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::get<true>(&pLVar13->children,1);
    pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->(pvVar16);
    if (pLVar13->type == LOGICAL_MATERIALIZED_CTE) {
      pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->(this_03);
      pvVar16 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::get<true>(&pLVar13->children,1);
      pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->(pvVar16);
      pvVar16 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::get<true>(&pLVar13->children,1);
      pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->(pvVar16);
      (*pLVar13->_vptr_LogicalOperator[2])(&compare_cond,pLVar13);
      ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::_M_move_assign
                (&plan_columns.
                  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>,
                 &compare_cond);
      ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
      ~_Vector_base((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
                    &compare_cond);
    }
    ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::vector
              ((vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)&local_148,
               &plan_columns.
                super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>);
    CreateDelimJoinConditions
              ((LogicalComparisonJoin *)delim_join._M_p,
               (vector<duckdb::CorrelatedColumnInfo,_true> *)local_210._8_8_,
               (vector<duckdb::ColumnBinding,_true> *)&local_148,flatten.delim_offset,
               (bool)delim_join._M_p[0x139]);
    ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
    ~_Vector_base(&local_148);
    if ((((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           *)(delim_join._M_p + 0x140))->
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ).
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start != *(pointer *)(delim_join._M_p + 0x148)) {
      if (delim_join._M_p[0x61] != '\x03') {
        this_02 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&compare_cond,
                   "Join condition for non-inner LATERAL JOIN must be a comparison between the left and right side"
                   ,(allocator *)local_210);
        BinderException::BinderException(this_02,(string *)&compare_cond);
        __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      make_uniq<duckdb::LogicalFilter>();
      pLVar21 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                ::operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                              *)&compare_cond);
      std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::_M_move_assign((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        *)&(pLVar21->super_LogicalOperator).expressions,
                       (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                        *)(delim_join._M_p + 0x140));
      pLVar21 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                ::operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                              *)&compare_cond);
      local_1e0._M_head_impl =
           (this_03->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (this_03->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      LogicalOperator::AddChild
                (&pLVar21->super_LogicalOperator,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_1e0);
      if (local_1e0._M_head_impl != (LogicalOperator *)0x0) {
        (*(local_1e0._M_head_impl)->_vptr_LogicalOperator[1])();
      }
      local_1e0._M_head_impl = (LogicalOperator *)0x0;
      this->binder = (Binder *)
                     compare_cond.left.
                     super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                     _M_t.
                     super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      goto LAB_01a8d332;
    }
    _Var24._M_head_impl =
         (this_03->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  }
  else {
    ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::vector
              ((vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)&local_160,
               &plan_columns.
                super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>);
    CreateDelimJoinConditions
              ((LogicalComparisonJoin *)delim_join._M_p,
               (vector<duckdb::CorrelatedColumnInfo,_true> *)local_210._8_8_,
               (vector<duckdb::ColumnBinding,_true> *)&local_160,flatten.delim_offset,
               (bool)delim_join._M_p[0x139]);
    ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
    ~_Vector_base(&local_160);
    if (delim_join._M_p[0x138] == ANY) {
      local_210._8_8_ = local_200._M_p + 0x158;
      pvVar2 = (vector<duckdb::LogicalType,_true> *)(local_200._M_p + 0x170);
      this_01 = (vector<duckdb::LogicalType,_true> *)(local_200._M_p + 0x188);
      this_04 = (vector<duckdb::JoinCondition,_true> *)(local_200._M_p + 0xb8);
      for (uVar25 = 0;
          uVar25 < (ulong)((long)*(pointer *)(local_200._M_p + 0x160) -
                           (long)(((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                    *)(local_200._M_p + 0x158))->
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar25 = uVar25 + 1) {
        compare_cond.left.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
              )0x0;
        compare_cond.right.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
              )0x0;
        pvVar22 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::get<true>((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                               *)local_210._8_8_,uVar25);
        _Var6._M_head_impl =
             (pvVar22->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar22->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        if (compare_cond.left.
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
             )0x0) {
          lVar7 = *(long *)compare_cond.left.
                           super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                           .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          compare_cond.left.
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
               _Var6._M_head_impl;
          (**(code **)(lVar7 + 8))();
          _Var6._M_head_impl =
               (Expression *)
               compare_cond.left.
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        }
        compare_cond.left.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             _Var6._M_head_impl;
        pvVar23 = vector<duckdb::LogicalType,_true>::get<true>(pvVar2,uVar25);
        args_1 = vector<duckdb::ColumnBinding,_true>::get<true>(&plan_columns,uVar25);
        make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType&,duckdb::ColumnBinding&>
                  ((duckdb *)(local_1f0 + 8),pvVar23,args_1);
        local_1f8._M_head_impl = (Expression *)local_1f0._8_8_;
        local_1f0._8_8_ = (long *)0x0;
        pvVar23 = vector<duckdb::LogicalType,_true>::get<true>(this_01,uVar25);
        BoundCastExpression::AddDefaultCastToType
                  ((BoundCastExpression *)local_210,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_1f8,pvVar23,false);
        uVar9 = local_210._0_8_;
        uVar8 = compare_cond.right;
        local_210._0_8_ = (_func_int **)0x0;
        compare_cond.right.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)uVar9;
        if ((uVar8.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
             (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
              )0x0) &&
           ((**(code **)(*(long *)uVar8.
                                  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                  .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl +
                        8))(), (_func_int **)local_210._0_8_ != (_func_int **)0x0)) {
          (**(code **)(*(_func_int **)local_210._0_8_ + 8))();
        }
        local_210._0_8_ = (Expression *)0x0;
        if (local_1f8._M_head_impl != (Expression *)0x0) {
          (*((local_1f8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_1f8._M_head_impl = (Expression *)0x0;
        if ((long *)local_1f0._8_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_1f0._8_8_ + 8))();
        }
        compare_cond.comparison = local_200._M_p[0x1a0];
        ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
        emplace_back<duckdb::JoinCondition>
                  ((vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> *)this_04,
                   &compare_cond);
        JoinCondition::~JoinCondition(&compare_cond);
      }
    }
    _Var24._M_head_impl =
         (this_03->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  }
  this->binder = (Binder *)_Var24._M_head_impl;
  (this_03->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
LAB_01a8d332:
  ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::~_Vector_base
            ((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
             &plan_columns);
  ~FlattenDependentJoins(&flatten);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> FlattenDependentJoins::Decorrelate(unique_ptr<LogicalOperator> plan,
                                                               bool parent_propagate_null_values, idx_t lateral_depth) {
	switch (plan->type) {
	case LogicalOperatorType::LOGICAL_DEPENDENT_JOIN: {
		auto &delim_join = plan;
		auto &op = plan->Cast<LogicalDependentJoin>();

		// If we have a parent, we unnest the left side of the DEPENDENT JOIN in the parent's context.
		if (parent) {
			// only push the dependent join to the left side, if there is correlation.
			auto entry = has_correlated_expressions.find(*plan);
			D_ASSERT(entry != has_correlated_expressions.end());

			if (entry->second) {
				op.children[0] =
				    PushDownDependentJoin(std::move(op.children[0]), parent_propagate_null_values, lateral_depth);
			} else {
				// There might be unrelated correlation, so we have to traverse the tree
				op.children[0] = DecorrelateIndependent(binder, std::move(op.children[0]));
			}

			// rewrite
			idx_t lateral_depth = 0;

			RewriteCorrelatedExpressions rewriter(base_binding, correlated_map, lateral_depth);
			rewriter.VisitOperator(*plan);

			RewriteCorrelatedExpressions recursive_rewriter(base_binding, correlated_map, lateral_depth, true);
			recursive_rewriter.VisitOperator(*plan);
		} else {
			op.children[0] = Decorrelate(std::move(op.children[0]));
		}

		if (!op.perform_delim) {
			// if we are not performing a delim join, we push a row_number() OVER() window operator on the LHS
			// and perform all duplicate elimination on that row number instead
			D_ASSERT(op.correlated_columns[0].type.id() == LogicalTypeId::BIGINT);
			auto window = make_uniq<LogicalWindow>(op.correlated_columns[0].binding.table_index);
			auto row_number = make_uniq<BoundWindowExpression>(ExpressionType::WINDOW_ROW_NUMBER, LogicalType::BIGINT,
			                                                   nullptr, nullptr);
			row_number->start = WindowBoundary::UNBOUNDED_PRECEDING;
			row_number->end = WindowBoundary::CURRENT_ROW_ROWS;
			row_number->SetAlias("delim_index");
			window->expressions.push_back(std::move(row_number));
			window->AddChild(std::move(op.children[0]));
			op.children[0] = std::move(window);
		}

		lateral_depth = 0;
		bool propagate_null_values = op.propagate_null_values;
		FlattenDependentJoins flatten(binder, op.correlated_columns, op.perform_delim, op.any_join, this);

		// first we check which logical operators have correlated expressions in the first place
		flatten.DetectCorrelatedExpressions(*delim_join->children[1], op.is_lateral_join, lateral_depth);

		// now we push the dependent join down
		delim_join->children[1] =
		    flatten.PushDownDependentJoin(std::move(delim_join->children[1]), propagate_null_values, lateral_depth);
		data_offset = flatten.data_offset;
		delim_offset = flatten.delim_offset;

		RewriteCorrelatedExpressions rewriter(base_binding, correlated_map, lateral_depth);
		rewriter.VisitOperator(*plan);

		op.duplicate_eliminated_columns.clear();
		op.mark_types.clear();
		for (idx_t i = 0; i < op.correlated_columns.size(); i++) {
			auto &col = op.correlated_columns[i];
			op.duplicate_eliminated_columns.push_back(make_uniq<BoundColumnRefExpression>(col.type, col.binding));
			op.mark_types.push_back(col.type);
		}

		// We are done using the operator as a DEPENDENT JOIN, it is now fully decorrelated,
		// and we change the type to a DELIM JOIN.
		delim_join->type = LogicalOperatorType::LOGICAL_DELIM_JOIN;

		auto plan_columns = delim_join->children[1]->GetColumnBindings();

		// Handle lateral joins
		if (op.is_lateral_join && op.subquery_type == SubqueryType::INVALID) {
			// in case of a materialized CTE, the output is defined by the second children operator
			if (delim_join->children[1]->type == LogicalOperatorType::LOGICAL_MATERIALIZED_CTE) {
				plan_columns = delim_join->children[1]->children[1]->GetColumnBindings();
			}

			// then add the delim join conditions
			CreateDelimJoinConditions(op, op.correlated_columns, plan_columns, flatten.delim_offset, op.perform_delim);

			// check if there are any arbitrary expressions left
			if (!op.arbitrary_expressions.empty()) {
				// we can only evaluate scalar arbitrary expressions for inner joins
				if (op.join_type != JoinType::INNER) {
					throw BinderException("Join condition for non-inner LATERAL JOIN must be a comparison between the "
					                      "left and right side");
				}
				auto filter = make_uniq<LogicalFilter>();
				filter->expressions = std::move(op.arbitrary_expressions);
				filter->AddChild(std::move(plan));
				return std::move(filter);
			}
			return plan;
		}

		CreateDelimJoinConditions(op, op.correlated_columns, plan_columns, flatten.delim_offset, op.perform_delim);

		if (op.subquery_type == SubqueryType::ANY) {
			// add the actual condition based on the ANY/ALL predicate
			for (idx_t child_idx = 0; child_idx < op.expression_children.size(); child_idx++) {
				JoinCondition compare_cond;
				compare_cond.left = std::move(op.expression_children[child_idx]);
				auto &child_type = op.child_types[child_idx];
				compare_cond.right = BoundCastExpression::AddDefaultCastToType(
				    make_uniq<BoundColumnRefExpression>(child_type, plan_columns[child_idx]),
				    op.child_targets[child_idx]);
				compare_cond.comparison = op.comparison_type;
				op.conditions.push_back(std::move(compare_cond));
			}
		}

		return plan;
	}
	default: {
		for (auto &child : plan->children) {
			child = Decorrelate(std::move(child));
		}
	}
	}

	return plan;
}